

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

floatx80 commonNaNToFloatx80(commonNaNT a,float_status *status)

{
  ulong uVar1;
  undefined8 in_RDX;
  ulong uVar2;
  floatx80 fVar3;
  
  if (status->default_nan_mode == '\0') {
    if (1 < a.high) {
      uVar1 = a.high >> 1 | 0x8000000000000000;
      uVar2 = (ulong)(a._0_4_ << 0xf | 0x7fff);
      goto LAB_0092a590;
    }
  }
  if (status->snan_bit_is_one != '\0') {
    __assert_fail("!snan_bit_is_one(status)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                  ,0xc5,"floatx80 floatx80_default_nan_mips64el(float_status *)");
  }
  uVar1 = 0xc000000000000000;
  uVar2 = CONCAT62((int6)((ulong)in_RDX >> 0x10),0xffff);
LAB_0092a590:
  fVar3._8_8_ = uVar2;
  fVar3.low = uVar1;
  return fVar3;
}

Assistant:

static floatx80 commonNaNToFloatx80(commonNaNT a, float_status *status)
{
    floatx80 z;

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.high >> 1) {
        z.low = UINT64_C(0x8000000000000000) | a.high >> 1;
        z.high = (((uint16_t)a.sign) << 15) | 0x7FFF;
    } else {
        z = floatx80_default_nan(status);
    }
    return z;
}